

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O3

int cf_gcm_decrypt(cf_prp *prp,void *prpctx,uint8_t *cipher,size_t ncipher,uint8_t *header,
                  size_t nheader,uint8_t *nonce,size_t nnonce,uint8_t *tag,size_t ntag,
                  uint8_t *plain)

{
  uint8_t *input;
  size_t bytes;
  size_t sVar1;
  byte bVar2;
  uint8_t e_Y0 [16];
  cf_ctr ctr;
  ghash_ctx gh;
  undefined8 local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  byte local_128 [16];
  uint8_t local_118 [16];
  byte local_108 [16];
  size_t local_f8;
  uint8_t *local_f0;
  uint8_t *local_e8;
  size_t local_e0;
  cf_ctr local_d8;
  ghash_ctx local_88;
  
  local_118[0] = '\0';
  local_118[1] = '\0';
  local_118[2] = '\0';
  local_118[3] = '\0';
  local_118[4] = '\0';
  local_118[5] = '\0';
  local_118[6] = '\0';
  local_118[7] = '\0';
  local_118[8] = '\0';
  local_118[9] = '\0';
  local_118[10] = '\0';
  local_118[0xb] = '\0';
  local_118[0xc] = '\0';
  local_118[0xd] = '\0';
  local_118[0xe] = '\0';
  local_118[0xf] = '\0';
  local_f0 = header;
  local_e8 = cipher;
  local_e0 = ncipher;
  (*prp->encrypt)(prpctx,local_118,local_118);
  if (nnonce == 0xc) {
    local_138 = *(undefined8 *)nonce;
    _uStack_130 = CONCAT44(0x1000000,*(undefined4 *)(nonce + 8));
  }
  else {
    local_88.len_cipher = 0;
    local_88.state = 0;
    local_88._76_4_ = 0;
    local_88.buffer_used = 0;
    local_88.len_aad = 0;
    local_88.buffer[0] = '\0';
    local_88.buffer[1] = '\0';
    local_88.buffer[2] = '\0';
    local_88.buffer[3] = '\0';
    local_88.buffer[4] = '\0';
    local_88.buffer[5] = '\0';
    local_88.buffer[6] = '\0';
    local_88.buffer[7] = '\0';
    local_88.buffer[8] = '\0';
    local_88.buffer[9] = '\0';
    local_88.buffer[10] = '\0';
    local_88.buffer[0xb] = '\0';
    local_88.buffer[0xc] = '\0';
    local_88.buffer[0xd] = '\0';
    local_88.buffer[0xe] = '\0';
    local_88.buffer[0xf] = '\0';
    local_88.Y[0] = 0;
    local_88.Y[1] = 0;
    local_88.Y[2] = 0;
    local_88.Y[3] = 0;
    local_88.H[0] = 0;
    local_88.H[1] = 0;
    local_88.H[2] = 0;
    local_88.H[3] = 0;
    local_f8 = nheader;
    cf_gf128_frombytes_be(local_118,local_88.H);
    local_88.state = 1;
    ghash_add_cipher(&local_88,nonce,nnonce);
    nheader = local_f8;
    ghash_final(&local_88,(uint8_t *)&local_138);
  }
  local_88.len_cipher = 0;
  local_88.state = 0;
  local_88._76_4_ = 0;
  local_88.buffer_used = 0;
  local_88.len_aad = 0;
  local_88.buffer[0] = '\0';
  local_88.buffer[1] = '\0';
  local_88.buffer[2] = '\0';
  local_88.buffer[3] = '\0';
  local_88.buffer[4] = '\0';
  local_88.buffer[5] = '\0';
  local_88.buffer[6] = '\0';
  local_88.buffer[7] = '\0';
  local_88.buffer[8] = '\0';
  local_88.buffer[9] = '\0';
  local_88.buffer[10] = '\0';
  local_88.buffer[0xb] = '\0';
  local_88.buffer[0xc] = '\0';
  local_88.buffer[0xd] = '\0';
  local_88.buffer[0xe] = '\0';
  local_88.buffer[0xf] = '\0';
  local_88.Y[0] = 0;
  local_88.Y[1] = 0;
  local_88.Y[2] = 0;
  local_88.Y[3] = 0;
  local_88.H[0] = 0;
  local_88.H[1] = 0;
  local_88.H[2] = 0;
  local_88.H[3] = 0;
  cf_gf128_frombytes_be(local_118,local_88.H);
  local_88.state = 1;
  ghash_add_aad(&local_88,local_f0,nheader);
  local_108[0] = 0;
  local_108[1] = 0;
  local_108[2] = 0;
  local_108[3] = 0;
  local_108[4] = 0;
  local_108[5] = 0;
  local_108[6] = 0;
  local_108[7] = 0;
  local_108[8] = 0;
  local_108[9] = 0;
  local_108[10] = 0;
  local_108[0xb] = 0;
  local_108[0xc] = 0;
  local_108[0xd] = 0;
  local_108[0xe] = 0;
  local_108[0xf] = 0;
  cf_ctr_init(&local_d8,prp,prpctx,(uint8_t *)&local_138);
  cf_ctr_custom_counter(&local_d8,0xc,4);
  cf_ctr_cipher(&local_d8,local_108,local_108,0x10);
  bytes = local_e0;
  input = local_e8;
  ghash_add_cipher(&local_88,local_e8,local_e0);
  ghash_final(&local_88,local_128);
  if (ntag - 2 < 0xf) {
    sVar1 = 0;
    do {
      local_128[sVar1] = local_128[sVar1] ^ local_108[sVar1];
      sVar1 = sVar1 + 1;
    } while (ntag != sVar1);
    sVar1 = 0;
    bVar2 = 0;
    do {
      bVar2 = bVar2 | local_128[sVar1] ^ tag[sVar1];
      sVar1 = sVar1 + 1;
    } while (ntag != sVar1);
    if (bVar2 == 0) {
      cf_ctr_cipher(&local_d8,input,plain,bytes);
    }
    return (uint)(bVar2 != 0);
  }
  abort();
}

Assistant:

int cf_gcm_decrypt(const cf_prp *prp, void *prpctx,
                   const uint8_t *cipher, size_t ncipher,
                   const uint8_t *header, size_t nheader,
                   const uint8_t *nonce, size_t nnonce,
                   const uint8_t *tag, size_t ntag,
                   uint8_t *plain)
{
  uint8_t H[16] = { 0 };
  uint8_t Y0[16]; 

  /* H = E_K(0^128) */
  prp->encrypt(prpctx, H, H);

  /* Produce CTR nonce, Y_0:
   *
   * if len(IV) == 96
   *   Y_0 = IV || 0^31 || 1
   * otherwise
   *   Y_0 = GHASH(H, {}, IV)
   */

  if (nnonce == 12)
  {
    memcpy(Y0, nonce, nnonce);
    Y0[12] = Y0[13] = Y0[14] = 0x00;
    Y0[15] = 0x01;
  } else {
    ghash_ctx gh;
    ghash_init(&gh, H);
    ghash_add_cipher(&gh, nonce, nnonce);
    ghash_final(&gh, Y0);
  }
  
  /* Hash AAD. */
  ghash_ctx gh;
  ghash_init(&gh, H);
  ghash_add_aad(&gh, header, nheader);

  /* Start counter mode, to obtain offset on tag. */
  uint8_t e_Y0[16] = { 0 };
  cf_ctr ctr;
  cf_ctr_init(&ctr, prp, prpctx, Y0);
  cf_ctr_custom_counter(&ctr, 12, 4);
  cf_ctr_cipher(&ctr, e_Y0, e_Y0, sizeof e_Y0);

  /* Hash ciphertext. */
  ghash_add_cipher(&gh, cipher, ncipher);

  /* Produce tag. */
  uint8_t full_tag[16];
  ghash_final(&gh, full_tag);
  assert(ntag > 1 && ntag <= 16);
  xor_bb(full_tag, full_tag, e_Y0, ntag);

  int err = 1;
  if (!mem_eq(full_tag, tag, ntag))
    goto x_err;
  
  /* Complete decryption. */
  cf_ctr_cipher(&ctr, cipher, plain, ncipher);
  err = 0;
 
x_err:
  mem_clean(H, sizeof H);
  mem_clean(Y0, sizeof Y0);
  mem_clean(e_Y0, sizeof e_Y0);
  mem_clean(full_tag, sizeof full_tag);
  mem_clean(&gh, sizeof gh);
  mem_clean(&ctr, sizeof ctr);
  return err;
}